

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O0

void __thiscall pbrt::BinaryWriter::BinaryWriter(BinaryWriter *this,ostream *str)

{
  _Map_pointer in_RSI;
  stack<std::shared_ptr<pbrt::SerializedEntity>,_std::deque<std::shared_ptr<pbrt::SerializedEntity>,_std::allocator<std::shared_ptr<pbrt::SerializedEntity>_>_>_>
  *in_RDI;
  int32_t formatTag;
  undefined4 local_14;
  _Map_pointer local_10;
  
  local_10 = in_RSI;
  std::
  stack<std::shared_ptr<pbrt::SerializedEntity>,std::deque<std::shared_ptr<pbrt::SerializedEntity>,std::allocator<std::shared_ptr<pbrt::SerializedEntity>>>>
  ::
  stack<std::deque<std::shared_ptr<pbrt::SerializedEntity>,std::allocator<std::shared_ptr<pbrt::SerializedEntity>>>,void>
            (in_RDI);
  in_RDI[1].c.
  super__Deque_base<std::shared_ptr<pbrt::SerializedEntity>,_std::allocator<std::shared_ptr<pbrt::SerializedEntity>_>_>
  ._M_impl.super__Deque_impl_data._M_map = local_10;
  std::
  map<std::shared_ptr<pbrt::Entity>,_int,_std::less<std::shared_ptr<pbrt::Entity>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::Entity>,_int>_>_>
  ::map((map<std::shared_ptr<pbrt::Entity>,_int,_std::less<std::shared_ptr<pbrt::Entity>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::Entity>,_int>_>_>
         *)0x127768);
  local_14 = 9;
  std::ostream::write((char *)in_RDI[1].c.
                              super__Deque_base<std::shared_ptr<pbrt::SerializedEntity>,_std::allocator<std::shared_ptr<pbrt::SerializedEntity>_>_>
                              ._M_impl.super__Deque_impl_data._M_map,(long)&local_14);
  return;
}

Assistant:

BinaryWriter(std::ostream& str)
      : binStream(str)
    {
      int32_t formatTag = ourFormatTag;
      binStream.write((char*)&formatTag,sizeof(formatTag));
    }